

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64-decode.c
# Opt level: O0

int lws_b64_decode_stateful
              (lws_b64state *s,char *in,size_t *in_len,uint8_t *out,size_t *out_size,int final)

{
  size_t sVar1;
  size_t *psVar2;
  size_t *psVar3;
  bool bVar4;
  char local_64;
  byte local_59;
  uint8_t v;
  uint8_t *end_out;
  uint8_t *orig_out;
  char *end_in;
  char *orig_in;
  int final_local;
  size_t *out_size_local;
  uint8_t *out_local;
  size_t *in_len_local;
  char *in_local;
  lws_b64state *s_local;
  
  psVar2 = (size_t *)(in + *in_len);
  sVar1 = *out_size;
  out_size_local = (size_t *)out;
  in_len_local = (size_t *)in;
  while( true ) {
    bVar4 = false;
    if ((in_len_local < psVar2) && (bVar4 = false, (char)*in_len_local != '\0')) {
      bVar4 = (uint8_t *)((long)out_size_local + 4U) < out + sVar1;
    }
    if (!bVar4) break;
    while( true ) {
      bVar4 = false;
      if ((s->i < 4) && (bVar4 = false, in_len_local < psVar2)) {
        bVar4 = (char)*in_len_local != '\0';
      }
      if (!bVar4) break;
      local_59 = '\0';
      s->c = 0;
      while( true ) {
        bVar4 = false;
        if ((in_len_local < psVar2) && (bVar4 = false, (char)*in_len_local != '\0')) {
          bVar4 = local_59 == '\0';
        }
        if (!bVar4) break;
        psVar3 = (size_t *)((long)in_len_local + 1);
        local_59 = (byte)*in_len_local;
        s->c = (uint)local_59;
        if (local_59 == 0x2d) {
          local_59 = 0x2b;
          s->c = 0x2b;
        }
        if (local_59 == 0x5f) {
          local_59 = 0x2f;
          s->c = 0x2f;
        }
        if ((local_59 < 0x2b) || (0x7a < local_59)) {
          local_59 = '\0';
        }
        else {
          local_59 = "|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                     [(int)(local_59 - 0x2b)];
        }
        in_len_local = psVar3;
        if (local_59 != '\0') {
          if (local_59 == '$') {
            local_64 = '\0';
          }
          else {
            local_64 = local_59 + -0x3d;
          }
          local_59 = local_64;
        }
      }
      if (s->c == 0) {
        s->quad[s->i] = '\0';
      }
      else {
        s->len = s->len + 1;
        if (local_59 != '\0') {
          s->quad[s->i] = local_59 + 0xff;
        }
      }
      s->i = s->i + 1;
    }
    if ((s->i == 4) || (final != 0)) {
      s->i = 0;
      if (((psVar2 <= in_len_local) || ((char)*in_len_local == '\0')) && (s->c == 0x3d)) {
        s->len = s->len - 1;
      }
      if (1 < s->len) {
        *(byte *)out_size_local = s->quad[0] << 2 | (byte)((int)(uint)s->quad[1] >> 4);
        out_size_local = (size_t *)((long)out_size_local + 1);
      }
      if (2 < s->len) {
        *(byte *)out_size_local = s->quad[1] << 4 | (byte)((int)(uint)s->quad[2] >> 2);
        out_size_local = (size_t *)((long)out_size_local + 1);
      }
      if (3 < s->len) {
        *(uchar *)out_size_local = s->quad[2] << 6 | s->quad[3];
        out_size_local = (size_t *)((long)out_size_local + 1);
      }
      s->done = (s->len - 1) + s->done;
      s->len = 0;
    }
  }
  *(undefined1 *)out_size_local = 0;
  *in_len = (ulong)(uint)((int)in_len_local - (int)in);
  *out_size = (ulong)(uint)((int)out_size_local - (int)out);
  return 0;
}

Assistant:

int
lws_b64_decode_stateful(struct lws_b64state *s, const char *in, size_t *in_len,
			uint8_t *out, size_t *out_size, int final)
{
	const char *orig_in = in, *end_in = in + *in_len;
	uint8_t *orig_out = out, *end_out = out + *out_size;

	while (in < end_in && *in && out + 4 < end_out) {

		for (; s->i < 4 && in < end_in && *in; s->i++) {
			uint8_t v;

			v = 0;
			s->c = 0;
			while (in < end_in && *in && !v) {
				s->c = v = (unsigned char)*in++;
				/* support the url base64 variant too */
				if (v == '-')
					s->c = v = '+';
				if (v == '_')
					s->c = v = '/';
				v = (uint8_t)((v < 43 || v > 122) ? 0 : decode[v - 43]);
				if (v)
					v = (uint8_t)((v == '$') ? 0 : v - 61);
			}
			if (s->c) {
				s->len++;
				if (v)
					s->quad[s->i] = (uint8_t)(v - 1);
			} else
				s->quad[s->i] = 0;
		}

		if (s->i != 4 && !final)
			continue;

		s->i = 0;

		/*
		 * "The '==' sequence indicates that the last group contained
		 * only one byte, and '=' indicates that it contained two
		 * bytes." (wikipedia)
		 */

		if ((in >= end_in || !*in) && s->c == '=')
			s->len--;

		if (s->len >= 2)
			*out++ = (uint8_t)(s->quad[0] << 2 | s->quad[1] >> 4);
		if (s->len >= 3)
			*out++ = (uint8_t)(s->quad[1] << 4 | s->quad[2] >> 2);
		if (s->len >= 4)
			*out++ = (uint8_t)(((s->quad[2] << 6) & 0xc0) | s->quad[3]);

		s->done += s->len - 1;
		s->len = 0;
	}

	*out = '\0';
	*in_len = (unsigned int)(in - orig_in);
	*out_size = (unsigned int)(out - orig_out);

	return 0;
}